

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv__backend_timeout(uv_loop_t *loop)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((loop->stop_flag == 0) &&
     ((((loop->active_handles != 0 || ((loop->active_reqs).count != 0)) &&
       (loop->pending_queue == (void **)loop->pending_queue[0])) &&
      ((loop->idle_handles == (void **)loop->idle_handles[0] &&
       (loop->closing_handles == (uv_handle_t *)0x0)))))) {
    pvVar1 = (loop->timer_heap).min;
    if (pvVar1 != (void *)0x0) {
      uVar2 = *(ulong *)((long)pvVar1 + 0x18);
      uVar4 = uVar2 - loop->time;
      uVar3 = 0;
      if ((loop->time <= uVar2 && uVar4 != 0) && (uVar3 = 0x7fffffff, uVar4 < 0x7fffffff)) {
        uVar3 = uVar4;
      }
      return (int)uVar3;
    }
    return -1;
  }
  return 0;
}

Assistant:

static int uv__backend_timeout(const uv_loop_t* loop) {
  if (loop->stop_flag == 0 &&
      /* uv__loop_alive(loop) && */
      (uv__has_active_handles(loop) || uv__has_active_reqs(loop)) &&
      QUEUE_EMPTY(&loop->pending_queue) &&
      QUEUE_EMPTY(&loop->idle_handles) &&
      loop->closing_handles == NULL)
    return uv__next_timeout(loop);
  return 0;
}